

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O2

void __thiscall
cppcms::impl::cgi::connection::on_some_content_read
          (connection *this,error_code *e,size_t n,context *context,ehandler *h)

{
  int code;
  request *this_00;
  pair<char_*,_unsigned_long> pVar1;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_70;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_68;
  context *local_60;
  __shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2> local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  string local_48;
  
  local_60 = context;
  if (e->_M_value == 0) {
    code = cppcms::http::context::on_content_progress(context,n);
    if (code != 0) {
      handle_http_error(this,code,context,h);
      return;
    }
    this_00 = cppcms::http::context::request(context);
    pVar1 = cppcms::http::request::get_buffer(this_00);
    if (pVar1.second == 0) {
      (*this->_vptr_connection[0x12])(this);
      booster::callback<void_(cppcms::http::context::completion_type)>::operator()
                (h,operation_completed);
      return;
    }
    std::__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::impl::cgi::connection,void>
              (local_58,(__weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> *)
                        &this->super_enable_shared_from_this<cppcms::impl::cgi::connection>);
    mfunc_to_io_handler<cppcms::impl::cgi::connection,std::shared_ptr<cppcms::impl::cgi::connection>,cppcms::http::context*,booster::callback<void(cppcms::http::context::completion_type)>const&,cppcms::http::context*,booster::callback<void(cppcms::http::context::completion_type)>>
              ((offset_in_connection_to_subr)&local_70,
               (shared_ptr<cppcms::impl::cgi::connection> *)on_some_content_read,(context **)0x0,
               (callback<void_(cppcms::http::context::completion_type)> *)local_58);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    intrusive_ptr(&local_68,&local_70);
    (*this->_vptr_connection[0x11])(this,pVar1.first,pVar1.second,&local_68);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr(&local_68);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr(&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  }
  else {
    (**(code **)(*(long *)e->_M_cat + 0x20))(&local_48);
    set_error(this,h,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void connection::on_some_content_read(booster::system::error_code const &e,size_t n,http::context *context,ehandler const &h)
{
	if(e) { set_error(h,e.message()); return; }


	int status = context->on_content_progress(n);
	if(status !=0) {
		 handle_http_error(status,context,h);
		 return;
	}

	std::pair<char *,size_t> buffer = context->request().get_buffer();

	if(buffer.second==0) {
		on_async_read_complete();
		h(http::context::operation_completed);
		return;
	}
	else {
		async_read_some(buffer.first,buffer.second,
			mfunc_to_io_handler(&connection::on_some_content_read,
				self(),
				context,
				h));
	}
}